

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O3

int CountNest(char *s)

{
  char cVar1;
  int iVar2;
  
  iVar2 = strcmp(s,"ENDC");
  if (iVar2 == 0) {
    return -1;
  }
  iVar2 = strcmp(s,"ENDIF");
  if (iVar2 == 0) {
    return -1;
  }
  iVar2 = 0;
  if (*s != 'I') {
    return 0;
  }
  if (s[1] != 'F') {
    return 0;
  }
  switch(s[2]) {
  case 'C':
  case 'D':
    cVar1 = s[3];
    goto joined_r0x0010b32e;
  case 'E':
    if (s[3] != 'Q') {
      return 0;
    }
LAB_0010b329:
    cVar1 = s[4];
joined_r0x0010b32e:
    if (cVar1 != '\0') {
      return 0;
    }
    break;
  default:
    goto switchD_0010b2d1_caseD_46;
  case 'G':
  case 'L':
    if ((s[3] != 'T') || (s[4] != '\0')) {
      if (s[3] != 'E') {
        return 0;
      }
      goto LAB_0010b329;
    }
    break;
  case 'N':
    if (((s[3] != 'E') || (s[4] != '\0')) && ((s[3] != 'C' || (s[4] != '\0')))) {
      if (s[3] != 'D') {
        return 0;
      }
      return (uint)(s[4] == '\0');
    }
  }
  iVar2 = 1;
switchD_0010b2d1_caseD_46:
  return iVar2;
}

Assistant:

int CountNest(s)
	register char *s;
/* Returns 1 if "s" contains any IF statement (i.e. IFEQ, etc.).
 Returns -1 if "s" contains "ENDC" or "ENDIF".
 Returns 0 in all other cases.              */
{
	if (strcmp(s, "ENDC") == 0)
		return (-1);
	else if (strcmp(s, "ENDIF") == 0)
		return (-1);
	else if (*s++ != 'I')
		return (0);
	else if (*s++ != 'F')
		return (0);
	else if (strcmp(s, "EQ") == 0)
		return (1);
	else if (strcmp(s, "NE") == 0)
		return (1);
	else if (strcmp(s, "GT") == 0)
		return (1);
	else if (strcmp(s, "GE") == 0)
		return (1);
	else if (strcmp(s, "LT") == 0)
		return (1);
	else if (strcmp(s, "LE") == 0)
		return (1);
	else if (strcmp(s, "C") == 0)
		return (1);
	else if (strcmp(s, "NC") == 0)
		return (1);
	else if (strcmp(s, "D") == 0)
		return (1);
	else if (strcmp(s, "ND") == 0)
		return (1);
	else
		return (0);
}